

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpapi_curl.c
# Opt level: O2

size_t HeadersWriteFunction(void *ptr,size_t size,size_t nmemb,void *userdata)

{
  char *__s;
  char *pcVar1;
  
  if (ptr != (void *)0x0) {
    __s = strtok((char *)ptr,"\r\n");
    while ((__s != (char *)0x0 && (*__s != '\0'))) {
      pcVar1 = strchr(__s,0x3a);
      if (pcVar1 != (char *)0x0) {
        *pcVar1 = '\0';
        HTTPHeaders_AddHeaderNameValuePair((HTTP_HEADERS_HANDLE)userdata,__s,pcVar1 + 1);
        *pcVar1 = ':';
      }
      __s = strtok((char *)0x0,"\r\n");
    }
  }
  return nmemb * size;
}

Assistant:

static size_t HeadersWriteFunction(void *ptr, size_t size, size_t nmemb, void *userdata)
{
    HTTP_HEADERS_HANDLE responseHeadersHandle = (HTTP_HEADERS_HANDLE)userdata;
    char* headerLine = (char*)ptr;

    if (headerLine != NULL)
    {
        char* token = strtok(headerLine, "\r\n");
        while ((token != NULL) &&
               (token[0] != '\0'))
        {
            char* whereIsColon = strchr(token, ':');
            if(whereIsColon!=NULL)
            {
                *whereIsColon='\0';
                HTTPHeaders_AddHeaderNameValuePair(responseHeadersHandle, token, whereIsColon+1);
                *whereIsColon=':';
            }
            else
            {
                /*not a header, maybe a status-line*/
            }
            token = strtok(NULL, "\r\n");
        }
    }

    return size * nmemb;
}